

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v6::internal::write_exponent<wchar_t,wchar_t*>(int exp,wchar_t *it)

{
  ulong uVar1;
  wchar_t *pwVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)-exp;
  if (0 < exp) {
    uVar4 = (ulong)(uint)exp;
  }
  *it = (exp >> 0x1f) * -2 + L'+';
  pwVar2 = it + 1;
  uVar3 = (uint)uVar4;
  if (99 < uVar3) {
    uVar1 = uVar4 / 100;
    uVar4 = uVar4 % 100;
    uVar1 = (ulong)(uint)((int)uVar1 * 2);
    if (999 < uVar3) {
      it[1] = (int)(char)basic_data<void>::digits[uVar1];
      pwVar2 = it + 2;
    }
    *pwVar2 = (int)(char)basic_data<void>::digits[uVar1 + 1];
    pwVar2 = pwVar2 + 1;
  }
  *pwVar2 = (int)(char)basic_data<void>::digits[uVar4 * 2];
  pwVar2[1] = (int)(char)basic_data<void>::digits[uVar4 * 2 + 1];
  return pwVar2 + 2;
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}